

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

size_t get_size<std::vector<example::option_t,std::allocator<example::option_t>>>(const_buffer buf)

{
  size_t sVar1;
  pointer poVar2;
  vector<example::option_t,_std::allocator<example::option_t>_> v;
  sizer s;
  vector<example::option_t,_std::allocator<example::option_t>_> local_48;
  sizer local_30;
  
  local_30.buf_.data_ = buf.data_;
  local_30.opts_.super_type.m_initialized = false;
  local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.buf_.size_ = buf.size_;
  detail::sizer::operator()(&local_30,&local_48);
  sVar1 = local_30.buf_.size_;
  for (poVar2 = local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      poVar2 != local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>.
                _M_impl.super__Vector_impl_data._M_finish; poVar2 = poVar2 + 1) {
    if ((poVar2->quote_ticks).super_optional<example::decimal_t>.super_type.m_initialized == true) {
      (poVar2->quote_ticks).super_optional<example::decimal_t>.super_type.m_initialized = false;
    }
  }
  if (local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<example::option_t,_std::allocator<example::option_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return buf.size_ - sVar1;
}

Assistant:

size_t get_size(asio::const_buffer buf) {
    detail::sizer s(buf);
    T v;
    s(v);
    return asio::buffer_size(buf) - asio::buffer_size(s.buf_);
}